

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g12s.c
# Opt level: O1

err_t g12sEcCreate(ec_o **pec,g12s_params *params,g12s_deep_i deep)

{
  uint uVar1;
  bool_t bVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  ec_o *ec;
  err_t eVar9;
  qr_o *r;
  ulong uVar10;
  void *stack;
  
  bVar2 = memIsValid(params,0x19c);
  eVar9 = 0x1f6;
  if (bVar2 != 0) {
    uVar1 = params->l;
    if (((ulong)uVar1 == 0x200) || (uVar1 == 0x100)) {
      sVar3 = memNonZeroSize(params->p,(ulong)uVar1 * 0x44 >> 9);
      uVar10 = sVar3 + 7 >> 3;
      sVar4 = gfpCreate_keep(sVar3);
      sVar5 = gfpCreate_deep(sVar3);
      sVar6 = ecpCreateJ_keep(sVar3);
      sVar7 = ecpCreateJ_deep(sVar3,sVar5);
      sVar8 = ecCreateGroup_deep(sVar5);
      sVar5 = (*deep)(uVar10,sVar5,3,sVar7);
      sVar5 = utilMax(3,sVar7,sVar8,sVar5);
      ec = (ec_o *)blobCreate(sVar4 + sVar6 + sVar5);
      if (ec == (ec_o *)0x0) {
        eVar9 = 0x6e;
      }
      else {
        r = (qr_o *)((long)&(ec->hdr).keep + sVar6);
        stack = (void *)((long)&(r->hdr).keep + sVar4);
        bVar2 = gfpCreate(r,params->p,sVar3,stack);
        if (bVar2 != 0) {
          sVar3 = wwBitSize(r->mod,uVar10);
          if (((params->l != 0x100) || (0xfd < sVar3)) && ((params->l != 0x200 || (0x1fb < sVar3))))
          {
            bVar2 = ecpCreateJ(ec,r,params->a,params->b,stack);
            if ((bVar2 != 0) &&
               (bVar2 = ecCreateGroup(ec,params->xP,params->yP,params->q,(ulong)(params->l >> 3),
                                      params->n,stack), bVar2 != 0)) {
              uVar10 = (ulong)(params->l + 0x3f >> 6);
              sVar3 = wwBitSize(ec->order,uVar10);
              if (((params->l != 0x100) || (0xfe < sVar3)) &&
                 (((params->l != 0x200 || (0x1fc < sVar3)) &&
                  (bVar2 = zzIsEven(ec->order,uVar10), bVar2 == 0)))) {
                objAppend(ec,r,0);
                *pec = ec;
                return 0;
              }
            }
            blobClose(ec);
            return 0x1f6;
          }
        }
        blobClose(ec);
        eVar9 = 0x1f6;
      }
    }
  }
  return eVar9;
}

Assistant:

static err_t g12sEcCreate(
	ec_o** pec,						/* [out] описание эллиптической кривой */
	const g12s_params* params,		/* [in] долговременные параметры */
	g12s_deep_i deep				/* [in] потребности в стековой памяти */
)
{
	// размерности
	size_t n, no, nb;
	size_t f_keep;
	size_t f_deep;
	size_t ec_d;
	size_t ec_keep;
	size_t ec_deep;
	// состояние
	void* state;	
	qr_o* f;			/* базовое поле */
	ec_o* ec;			/* кривая */
	void* stack;
	// pre
	ASSERT(memIsValid(pec, sizeof(*pec)));
	// минимальная проверка входных данных
	if (!memIsValid(params, sizeof(g12s_params)) ||
		params->l != 256 && params->l != 512)
		return ERR_BAD_PARAMS;
	// определить размерности
	no = memNonZeroSize(params->p, sizeof(params->p) * params->l / 512);
	n = W_OF_O(no);
	f_keep = gfpCreate_keep(no);
	f_deep = gfpCreate_deep(no);
	ec_d = 3;
	ec_keep = ecpCreateJ_keep(no);
	ec_deep = ecpCreateJ_deep(no, f_deep);
	// создать состояние
	state = blobCreate(
		f_keep + ec_keep +
		utilMax(3,
			ec_deep,
			ecCreateGroup_deep(f_deep),
			deep(n, f_deep, ec_d, ec_deep)));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// создать поле
	f = (qr_o*)((octet*)state + ec_keep);
	stack = (octet*)f + f_keep;
	if (!gfpCreate(f, params->p, no, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// проверить длину p
	nb = wwBitSize(f->mod, n);
	if (params->l == 256 && nb <= 253 ||
		params->l == 512 && nb <= 507)
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// создать кривую и группу
	ec = (ec_o*)state;
	if (!ecpCreateJ(ec, f, params->a, params->b, stack) ||
		!ecCreateGroup(ec, params->xP, params->yP, params->q, 
			params->l / 8, params->n, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// проверить q
	n = W_OF_B(params->l);
	nb = wwBitSize(ec->order, n);
	if (params->l == 256 && nb <= 254 ||
		params->l == 512 && nb <= 508 ||
		zzIsEven(ec->order, n))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// присоединить f к ec
	objAppend(ec, f, 0);
	// все нормально
	*pec = ec;
	return ERR_OK;
}